

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  Int32 IVar1;
  long lVar2;
  _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  *this;
  pointer pSVar3;
  ShaderStageInfoVk *pSVar4;
  size_t sVar5;
  undefined7 in_register_00000011;
  allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk> *extraout_RDX;
  ulong __n;
  long lVar6;
  Uint32 i;
  ulong uVar7;
  pointer pSVar8;
  anon_class_32_4_a6542874 AddShader;
  string msg_1;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)&UniqueShaders,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    ActiveShaderStages = (SHADER_TYPE *)0x118;
    DebugAssertionFailed
              ((Char *)UniqueShaders._M_h._M_buckets,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)&UniqueShaders);
  }
  UniqueShaders._M_h._M_buckets = &UniqueShaders._M_h._M_single_bucket;
  UniqueShaders._M_h._M_bucket_count = 1;
  UniqueShaders._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueShaders._M_h._M_element_count = 0;
  UniqueShaders._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueShaders._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueShaders._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AddShader.UniqueShaders = &UniqueShaders;
  AddShader.WaitUntilShadersReady = true;
  AddShader.ShaderStages = ShaderStages;
  AddShader.ActiveShaderStages = (SHADER_TYPE *)CONCAT71(in_register_00000011,WaitUntilShadersReady)
  ;
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::clear(ShaderStages);
  pSVar8 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pSVar4 - (long)pSVar8;
  if ((ulong)(lVar6 / 0x50) < 6) {
    uVar7 = 6 - lVar6 / 0x50;
    lVar2 = (long)(ShaderStages->
                  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4;
    if ((ulong)(lVar2 / 0x50) < uVar7) {
      __n = uVar7;
      this = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
              *)std::
                vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                ::_M_check_len(ShaderStages,uVar7,"vector::_M_default_append");
      pSVar3 = std::
               _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ::_M_allocate(this,__n);
      std::
      __uninitialized_default_n_a<Diligent::(anonymous_namespace)::ShaderStageInfoVk*,unsigned_long,Diligent::(anonymous_namespace)::ShaderStageInfoVk>
                ((ShaderStageInfoVk *)(lVar6 + (long)pSVar3),uVar7,extraout_RDX);
      std::
      vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ::_S_relocate((ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_start,
                    (ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_finish,pSVar3,
                    (_Tp_alloc_type *)ActiveShaderStages);
      pSVar8 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = (long)(ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8;
      ActiveShaderStages = (SHADER_TYPE *)0x50;
      std::
      _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ::_M_deallocate((_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                       *)pSVar8,(pointer)(lVar2 / 0x50),lVar2 % 0x50);
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_start = pSVar3;
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (ShaderStageInfoVk *)(lVar6 + (long)pSVar3) + uVar7;
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3 + (long)this;
    }
    else {
      pSVar4 = std::
               __uninitialized_default_n_a<Diligent::(anonymous_namespace)::ShaderStageInfoVk*,unsigned_long,Diligent::(anonymous_namespace)::ShaderStageInfoVk>
                         (pSVar4,uVar7,
                          (allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk> *)
                          (lVar2 % 0x50));
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar4;
    }
  }
  else if (lVar6 != 0x1e0) {
    std::
    vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
    ::_M_erase_at_end(ShaderStages,pSVar8 + 6);
  }
  *(SHADER_TYPE *)CONCAT71(in_register_00000011,WaitUntilShadersReady) = SHADER_TYPE_UNKNOWN;
  lVar6 = 8;
  for (uVar7 = 0; uVar7 < CreateInfo->GeneralShaderCount; uVar7 = uVar7 + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar6));
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  for (uVar7 = 0; uVar7 < CreateInfo->TriangleHitShaderCount; uVar7 = uVar7 + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar6));
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar6));
    lVar6 = lVar6 + 0x18;
  }
  lVar6 = 0;
  for (uVar7 = 0; uVar7 < CreateInfo->ProceduralHitShaderCount; uVar7 = uVar7 + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar6))
    ;
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar6));
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar6));
    lVar6 = lVar6 + 0x20;
  }
  IVar1 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  sVar5 = PipelineStateVkImpl::ShaderStageInfo::Count
                    (&(ShaderStages->
                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                      )._M_impl.super__Vector_impl_data._M_start[IVar1].super_ShaderStageInfo);
  if (sVar5 == 0) {
    ActiveShaderStages = (SHADER_TYPE *)0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  pSVar8 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (pSVar8 != (ShaderStages->
                   super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
    sVar5 = PipelineStateVkImpl::ShaderStageInfo::Count(&pSVar8->super_ShaderStageInfo);
    if (sVar5 == 0) {
      pSVar3 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar8 + 1 != pSVar3) {
        lVar6 = ((long)pSVar3 - (long)(pSVar8 + 1)) / 0x50;
        pSVar3 = pSVar8;
        for (; 0 < lVar6; lVar6 = lVar6 + -1) {
          PipelineStateVkImpl::ShaderStageInfo::operator=
                    (&pSVar3->super_ShaderStageInfo,&pSVar3[1].super_ShaderStageInfo);
          std::
          vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
          ::_M_move_assign(&pSVar3->Serialized,&pSVar3[1].Serialized);
          pSVar3 = pSVar3 + 1;
        }
        pSVar3 = (ShaderStages->
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar3 + -1;
      anon_unknown_60::ShaderStageInfoVk::~ShaderStageInfoVk(pSVar3 + -1);
    }
    else {
      pSVar8 = pSVar8 + 1;
    }
  }
  if ((ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_start == pSVar8) {
    FormatString<char[26],char[22]>
              (&msg_1,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])ActiveShaderStages);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&UniqueShaders._M_h);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}